

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
zmq::server_t::xattach_pipe
          (server_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_zmq::server_t::outpipe_t>_>,_bool> pVar1
  ;
  uint32_t routing_id;
  outpipe_t outpipe;
  uint32_t local_2c;
  outpipe_t local_28;
  
  if (pipe_ == (pipe_t *)0x0) {
    xattach_pipe();
  }
  local_2c = this->_next_routing_id;
  this->_next_routing_id = local_2c + 1;
  if (local_2c == 0) {
    this->_next_routing_id = 2;
    local_2c = local_2c + 1;
  }
  pipe_t::set_server_socket_routing_id(pipe_,local_2c);
  local_28.active = true;
  local_28.pipe = pipe_;
  pVar1 = std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,zmq::server_t::outpipe_t>,std::_Select1st<std::pair<unsigned_int_const,zmq::server_t::outpipe_t>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,zmq::server_t::outpipe_t>>>
          ::_M_emplace_unique<unsigned_int&,zmq::server_t::outpipe_t&>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,zmq::server_t::outpipe_t>,std::_Select1st<std::pair<unsigned_int_const,zmq::server_t::outpipe_t>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,zmq::server_t::outpipe_t>>>
                      *)&this->_out_pipes,&local_2c,&local_28);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    xattach_pipe();
  }
  fq_t::attach(&this->_fq,pipe_);
  return;
}

Assistant:

void zmq::server_t::xattach_pipe (pipe_t *pipe_,
                                  bool subscribe_to_all_,
                                  bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);

    uint32_t routing_id = _next_routing_id++;
    if (!routing_id)
        routing_id = _next_routing_id++; //  Never use Routing ID zero

    pipe_->set_server_socket_routing_id (routing_id);
    //  Add the record into output pipes lookup table
    outpipe_t outpipe = {pipe_, true};
    const bool ok =
      _out_pipes.ZMQ_MAP_INSERT_OR_EMPLACE (routing_id, outpipe).second;
    zmq_assert (ok);

    _fq.attach (pipe_);
}